

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromExtract
          (CopyPropagateArrays *this,Instruction *extract_inst)

{
  uint32_t index;
  uint uVar1;
  Instruction *in_RDX;
  pointer *__ptr;
  uint uVar2;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  result;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  components;
  undefined1 local_58 [8];
  undefined1 local_50 [16];
  _Manager_type p_Stack_40;
  _Invoker_type local_38;
  
  if (in_RDX->opcode_ == OpCompositeExtract) {
    index = (in_RDX->has_result_id_ & 1) + 1;
    if (in_RDX->has_type_id_ == false) {
      index = (uint)in_RDX->has_result_id_;
    }
    Instruction::GetSingleWordOperand(in_RDX,index);
    GetSourceObjectIfAny((CopyPropagateArrays *)local_58,(uint32_t)extract_inst);
    if (local_58 == (undefined1  [8])0x0) {
      (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
    }
    else {
      local_50._8_8_ = (void *)0x0;
      p_Stack_40 = (_Manager_type)0x0;
      local_38 = (_Invoker_type)0x0;
      uVar1 = (in_RDX->has_result_id_ & 1) + 1;
      if (in_RDX->has_type_id_ == false) {
        uVar1 = (uint)in_RDX->has_result_id_;
      }
      if (1 < (int)((ulong)((long)(in_RDX->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(in_RDX->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar1) {
        uVar2 = 1;
        do {
          local_50[0] = '\0';
          local_50._4_4_ = Instruction::GetSingleWordOperand(in_RDX,uVar1 + uVar2);
          std::
          vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
          ::emplace_back<spvtools::opt::CopyPropagateArrays::AccessChainEntry>
                    ((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                      *)(local_50 + 8),(AccessChainEntry *)local_50);
          uVar2 = uVar2 + 1;
          uVar1 = (in_RDX->has_result_id_ & 1) + 1;
          if (in_RDX->has_type_id_ == false) {
            uVar1 = (uint)in_RDX->has_result_id_;
          }
        } while (uVar2 < (int)((ulong)((long)(in_RDX->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(in_RDX->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar1);
      }
      std::
      vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::CopyPropagateArrays::AccessChainEntry_const*,std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>>>>
                ((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>>
                  *)((long)local_58 + 8),
                 (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                    *)((long)local_58 + 8))->
                 super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish,local_50._8_8_,p_Stack_40);
      (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)local_58;
      local_58 = (undefined1  [8])0x0;
      if ((void *)local_50._8_8_ != (void *)0x0) {
        operator_delete((void *)local_50._8_8_,(long)local_38 - local_50._8_8_);
      }
    }
    if (local_58 != (undefined1  [8])0x0) {
      std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)local_58,
                 (MemoryObject *)local_58);
    }
    return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )this;
  }
  __assert_fail("extract_inst->opcode() == spv::Op::OpCompositeExtract && \"Expecting an OpCompositeExtract instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                ,0x132,
                "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromExtract(Instruction *)"
               );
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromExtract(Instruction* extract_inst) {
  assert(extract_inst->opcode() == spv::Op::OpCompositeExtract &&
         "Expecting an OpCompositeExtract instruction.");
  std::unique_ptr<MemoryObject> result = GetSourceObjectIfAny(
      extract_inst->GetSingleWordInOperand(kCompositeExtractObjectInOperand));

  if (!result) {
    return nullptr;
  }

  // Copy the indices of the extract instruction to |OpAccessChain| indices.
  std::vector<AccessChainEntry> components;
  for (uint32_t i = 1; i < extract_inst->NumInOperands(); ++i) {
    components.push_back({false, {extract_inst->GetSingleWordInOperand(i)}});
  }
  result->PushIndirection(components);
  return result;
}